

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtDec.c
# Opt level: O0

void Rwt_ManPreprocess(Rwt_Man_t *p)

{
  int iVar1;
  unsigned_short *puVar2;
  Vec_Vec_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  Rwt_Node_t *pNode_00;
  Rwt_Node_t *pRVar5;
  int local_28;
  int local_24;
  int k;
  int i;
  Rwt_Node_t *pNode;
  Dec_Graph_t *pGraph;
  Rwt_Man_t *p_local;
  
  puVar2 = (unsigned_short *)malloc(0x1bc);
  p->pMapInv = puVar2;
  memset(p->pMapInv,0,0x1bc);
  pVVar3 = Vec_VecStart(0xde);
  p->vClasses = pVVar3;
  local_24 = 0;
  do {
    if (p->nFuncs <= local_24) {
      for (local_24 = 0; iVar1 = Vec_VecSize(p->vClasses), local_24 < iVar1; local_24 = local_24 + 1
          ) {
        local_28 = 0;
        while( true ) {
          pVVar4 = Vec_VecEntry(p->vClasses,local_24);
          iVar1 = Vec_PtrSize(pVVar4);
          if (iVar1 <= local_28) break;
          pVVar4 = Vec_VecEntry(p->vClasses,local_24);
          pNode_00 = (Rwt_Node_t *)Vec_PtrEntry(pVVar4,local_28);
          pRVar5 = (Rwt_Node_t *)Rwt_NodePreprocess(p,pNode_00);
          pNode_00->pNext = pRVar5;
          local_28 = local_28 + 1;
        }
      }
      return;
    }
    if (p->pTable[local_24] != (Rwt_Node_t *)0x0) {
      for (_k = p->pTable[local_24]; _k != (Rwt_Node_t *)0x0; _k = _k->pNext) {
        if ((*(uint *)&_k->field_0x8 & 0xffff) !=
            (*(uint *)&p->pTable[local_24]->field_0x8 & 0xffff)) {
          __assert_fail("pNode->uTruth == p->pTable[i]->uTruth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                        ,0x41,"void Rwt_ManPreprocess(Rwt_Man_t *)");
        }
        if (0xdd < p->pMap[*(uint *)&_k->field_0x8 & 0xffff]) {
          __assert_fail("p->pMap[pNode->uTruth] < 222",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                        ,0x42,"void Rwt_ManPreprocess(Rwt_Man_t *)");
        }
        Vec_VecPush(p->vClasses,(uint)p->pMap[*(uint *)&_k->field_0x8 & 0xffff],_k);
        p->pMapInv[p->pMap[*(uint *)&_k->field_0x8 & 0xffff]] =
             p->puCanons[*(uint *)&_k->field_0x8 & 0xffff];
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Rwt_ManPreprocess( Rwt_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwt_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Always >= 0 b/c unsigned.
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwt_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwt_NodePreprocess( p, pNode );
        pNode->pNext = (Rwt_Node_t *)pGraph;
//        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}